

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

long data_cb_resampler(cubeb_stream *param_1,void *user_ptr,void *input_buffer,void *output_buffer,
                      long frame_count)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  
  auto_array<float>::push
            ((auto_array<float> *)((long)user_ptr + 0x20),(float *)input_buffer,
             (ulong)*(uint *)((long)user_ptr + 0x10) * frame_count);
  uVar2 = *(int *)((long)user_ptr + 4) - *(uint32_t *)((long)user_ptr + 8);
  uVar3 = (ulong)uVar2;
  if ((uint)frame_count <= uVar2) {
    uVar3 = frame_count & 0xffffffff;
  }
  uVar1 = fill_with_sine((float *)output_buffer,*(uint32_t *)((long)user_ptr + 0x1c),
                         *(uint32_t *)((long)user_ptr + 0x14),(uint32_t)uVar3,
                         *(uint32_t *)((long)user_ptr + 8));
  *(uint32_t *)((long)user_ptr + 8) = uVar1;
  return uVar3;
}

Assistant:

long data_cb_resampler(cubeb_stream * /*stm*/, void * user_ptr,
             const void * input_buffer, void * output_buffer, long frame_count)
{
  osc_state * state = reinterpret_cast<osc_state*>(user_ptr);
  const float * in = reinterpret_cast<const float*>(input_buffer);
  float * out = reinterpret_cast<float*>(output_buffer);

  state->input.push(in, frame_count * state->input_channels);

  /* Check how much output frames we need to write */
  uint32_t remaining = state->max_output_phase_index - state->output_phase_index;
  uint32_t to_write = std::min<uint32_t>(remaining, frame_count);
  state->output_phase_index = fill_with_sine(out,
                                             state->target_rate,
                                             state->output_channels,
                                             to_write,
                                             state->output_phase_index);

  return to_write;
}